

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix4d * tinyusdz::orthonormalize(matrix4d *__return_storage_ptr__,matrix4d *m,bool *result_valid)

{
  double a;
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  double eps;
  matrix4d *ret;
  double min_vector_length;
  undefined1 auStack_60 [7];
  bool result;
  double3 r2;
  double3 r1;
  double3 r0;
  bool *result_valid_local;
  matrix4d *m_local;
  
  value::matrix4d::identity();
  r1._M_elems[2] = m->m[0][0];
  r2._M_elems[2] = m->m[1][0];
  r1._M_elems[0] = m->m[1][1];
  r1._M_elems[1] = m->m[1][2];
  _auStack_60 = m->m[2][0];
  r2._M_elems[0] = m->m[2][1];
  r2._M_elems[1] = m->m[2][2];
  bVar1 = orthonormalize_basis
                    ((double3 *)(r1._M_elems + 2),(double3 *)(r2._M_elems + 2),(double3 *)auStack_60
                     ,true,1e-06);
  pvVar3 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)(r1._M_elems + 2),0);
  __return_storage_ptr__->m[0][0] = *pvVar3;
  pvVar3 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)(r1._M_elems + 2),1);
  __return_storage_ptr__->m[0][1] = *pvVar3;
  pvVar3 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)(r1._M_elems + 2),2);
  __return_storage_ptr__->m[0][2] = *pvVar3;
  pvVar3 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)(r2._M_elems + 2),0);
  __return_storage_ptr__->m[1][0] = *pvVar3;
  pvVar3 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)(r2._M_elems + 2),1);
  __return_storage_ptr__->m[1][1] = *pvVar3;
  pvVar3 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)(r2._M_elems + 2),2);
  __return_storage_ptr__->m[1][2] = *pvVar3;
  pvVar3 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)auStack_60,0);
  __return_storage_ptr__->m[2][0] = *pvVar3;
  pvVar3 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)auStack_60,1);
  __return_storage_ptr__->m[2][1] = *pvVar3;
  pvVar3 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)auStack_60,2);
  __return_storage_ptr__->m[2][2] = *pvVar3;
  a = __return_storage_ptr__->m[3][3];
  eps = ::std::numeric_limits<double>::epsilon();
  bVar2 = math::is_close(a,1.0,eps);
  if (!bVar2) {
    bVar2 = math::is_close(__return_storage_ptr__->m[3][3],0.0,1e-10);
    if (!bVar2) {
      __return_storage_ptr__->m[3][0] =
           __return_storage_ptr__->m[3][0] / __return_storage_ptr__->m[3][3];
      __return_storage_ptr__->m[3][1] =
           __return_storage_ptr__->m[3][1] / __return_storage_ptr__->m[3][3];
      __return_storage_ptr__->m[3][2] =
           __return_storage_ptr__->m[3][2] / __return_storage_ptr__->m[3][3];
      __return_storage_ptr__->m[3][3] = 1.0;
    }
  }
  if (result_valid != (bool *)0x0) {
    *result_valid = bVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d orthonormalize(const value::matrix4d &m, bool *result_valid) {
  value::matrix4d ret = value::matrix4d::identity();

  // orthogonalize and normalize row vectors
  value::double3 r0{m.m[0][0], m.m[0][1], m.m[0][2]};
  value::double3 r1{m.m[1][0], m.m[1][1], m.m[1][2]};
  value::double3 r2{m.m[2][0], m.m[2][1], m.m[2][2]};
  bool result = orthonormalize_basis(r0, r1, r2, true);
  ret.m[0][0] = r0[0];
  ret.m[0][1] = r0[1];
  ret.m[0][2] = r0[2];
  ret.m[1][0] = r1[0];
  ret.m[1][1] = r1[1];
  ret.m[1][2] = r1[2];
  ret.m[2][0] = r2[0];
  ret.m[2][1] = r2[1];
  ret.m[2][2] = r2[2];

  // divide out any homogeneous coordinate - unless it's zero
  const double min_vector_length = 1e-10;  //
  if (!math::is_close(ret.m[3][3], 1.0,
                      std::numeric_limits<double>::epsilon()) &&
      !math::is_close(ret.m[3][3], 0.0, min_vector_length)) {
    ret.m[3][0] /= ret.m[3][3];
    ret.m[3][1] /= ret.m[3][3];
    ret.m[3][2] /= ret.m[3][3];
    ret.m[3][3] = 1.0;
  }

  if (result_valid) {
    (*result_valid) = result;
    // TF_WARN("OrthogonalizeBasis did not converge, matrix may not be "
    //               "orthonormal.");
  }

  return ret;
}